

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QList<int>>::resolve<QList<int>>
          (PromiseResolver<QList<int>> *this,QList<int> *value)

{
  QPromise<QList<int>_> *pQVar1;
  Data *pDVar2;
  PromiseData<QList<int>_> *pPVar3;
  QPromise<QList<int>_> *promise;
  QList<int> *value_local;
  PromiseResolver<QList<int>_> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
           operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>
                       *)this);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<QList<int>_> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_>::operator->
                       (&(pQVar1->super_QPromiseBase<QList<int>_>).m_d);
    PromiseData<QList<int>>::resolve<QList<int>>((PromiseData<QList<int>> *)pPVar3,value);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_>::operator->
                       (&(pQVar1->super_QPromiseBase<QList<int>_>).m_d);
    PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
    PromiseResolver<QList<int>_>::release((PromiseResolver<QList<int>_> *)this);
  }
  return;
}

Assistant:

void resolve(V&& value)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve(std::forward<V>(value));
            promise->m_d->dispatch();
            release();
        }
    }